

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzD::NodeIntLoadResidual_Mv
          (ChNodeFEAxyzD *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  dVar11 = c;
  (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])();
  dVar11 = dVar11 * c;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,(ulong)off);
  dVar1 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,(ulong)off);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar11;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar10;
  auVar2 = vfmadd213sd_fma(auVar18,auVar12,auVar2);
  *pSVar10 = auVar2._0_8_;
  (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])(this);
  dVar11 = dVar11 * c;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                      (ulong)(off + 1));
  dVar1 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 1));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar11;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar10;
  auVar2 = vfmadd213sd_fma(auVar19,auVar13,auVar3);
  *pSVar10 = auVar2._0_8_;
  (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])(this);
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                      (ulong)(off + 2));
  dVar1 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 2));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar11 * c;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar10;
  auVar2 = vfmadd213sd_fma(auVar20,auVar14,auVar4);
  *pSVar10 = auVar2._0_8_;
  iVar8 = (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])(this);
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var,iVar8),0);
  dVar1 = *pSVar10;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                      (ulong)(off + 3));
  dVar11 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 3));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = c * dVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar11;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *pSVar10;
  auVar2 = vfmadd213sd_fma(auVar21,auVar15,auVar5);
  *pSVar10 = auVar2._0_8_;
  iVar8 = (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])(this);
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_00,iVar8),1);
  dVar1 = *pSVar10;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                      (ulong)(off + 4));
  dVar11 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 4));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = c * dVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar11;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar10;
  auVar2 = vfmadd213sd_fma(auVar22,auVar16,auVar6);
  *pSVar10 = auVar2._0_8_;
  iVar8 = (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])(this);
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_01,iVar8),2);
  dVar1 = *pSVar10;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                      (ulong)(off + 5));
  dVar11 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 5));
  auVar17._8_8_ = 0;
  auVar17._0_8_ = c * dVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar11;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *pSVar10;
  auVar2 = vfmadd213sd_fma(auVar23,auVar17,auVar7);
  *pSVar10 = auVar2._0_8_;
  return;
}

Assistant:

void ChNodeFEAxyzD::NodeIntLoadResidual_Mv(const unsigned int off,
                                           ChVectorDynamic<>& R,
                                           const ChVectorDynamic<>& w,
                                           const double c) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    R(off + 3) += c * GetMassDiagonal()(0) * w(off + 3);  // unuseful? mass for D isalways zero..
    R(off + 4) += c * GetMassDiagonal()(1) * w(off + 4);
    R(off + 5) += c * GetMassDiagonal()(2) * w(off + 5);
}